

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

int uv__signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum,int oneshot)

{
  byte *pbVar1;
  uint *puVar2;
  uint uVar3;
  uv__signal_tree_s uVar4;
  uv_signal_s *puVar5;
  byte bVar6;
  int iVar7;
  uv_signal_t *puVar8;
  long lVar9;
  uv_signal_s *puVar10;
  uv_signal_s *puVar11;
  uv_signal_s *puVar12;
  uv_signal_s *puVar13;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar14;
  uv__signal_tree_s *puVar15;
  sigset_t saved_sigmask;
  sigset_t sStack_a8;
  
  if ((handle->flags & 3) != 0) {
    __assert_fail("!uv__is_closing(handle)",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/signal.c"
                  ,0x16a,"int uv__signal_start(uv_signal_t *, uv_signal_cb, int, int)");
  }
  if (signum == 0) {
    iVar7 = -0x16;
  }
  else if (handle->signum == signum) {
    handle->signal_cb = signal_cb;
    iVar7 = 0;
  }
  else {
    if (handle->signum != 0) {
      uv__signal_stop(handle);
    }
    uv__signal_block_and_lock(&sStack_a8);
    puVar8 = uv__signal_first_handle(signum);
    if (((puVar8 == (uv_signal_t *)0x0) || ((oneshot == 0 && ((puVar8->flags & 0x2000000) != 0))))
       && (iVar7 = uv__signal_register_handler(signum,oneshot), iVar7 != 0)) {
      uv__signal_unlock_and_unblock(&sStack_a8);
    }
    else {
      handle->signum = signum;
      if (oneshot != 0) {
        pbVar1 = (byte *)((long)&handle->flags + 3);
        *pbVar1 = *pbVar1 | 2;
      }
      uVar4.rbh_root = uv__signal_tree.rbh_root;
      if (uv__signal_tree.rbh_root == (uv_signal_s *)0x0) {
        puVar8 = (uv_signal_t *)0x0;
        bVar6 = 0;
      }
      else {
        do {
          puVar8 = uVar4.rbh_root;
          iVar7 = uv__signal_compare(handle,puVar8);
          if (iVar7 < 0) {
            lVar9 = 0x70;
          }
          else {
            lVar9 = 0x78;
            if (iVar7 == 0) goto LAB_00157e56;
          }
          uVar4.rbh_root = *(uv_signal_s **)((long)&puVar8->data + lVar9);
        } while (uVar4.rbh_root != (uv_signal_t *)0x0);
        bVar6 = (byte)((uint)iVar7 >> 0x1f);
      }
      (handle->tree_entry).rbe_parent = puVar8;
      (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
      (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
      (handle->tree_entry).rbe_color = 1;
      if (puVar8 == (uv_signal_t *)0x0) {
        puVar15 = &uv__signal_tree;
      }
      else if (bVar6 == 0) {
        puVar15 = (uv__signal_tree_s *)&(puVar8->tree_entry).rbe_right;
      }
      else {
        puVar15 = (uv__signal_tree_s *)&puVar8->tree_entry;
      }
      ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar15)->rbe_left = handle;
      puVar12 = (handle->tree_entry).rbe_parent;
      puVar5 = handle;
      while ((puVar12 != (uv_signal_s *)0x0 && ((puVar12->tree_entry).rbe_color == 1))) {
        puVar11 = (puVar12->tree_entry).rbe_parent;
        puVar13 = (puVar11->tree_entry).rbe_left;
        puVar10 = puVar5;
        if (puVar12 == puVar13) {
          puVar13 = (puVar11->tree_entry).rbe_right;
          if ((puVar13 != (uv_signal_s *)0x0) && ((puVar13->tree_entry).rbe_color == 1))
          goto LAB_00157c79;
          puVar13 = (puVar12->tree_entry).rbe_right;
          if (puVar13 == puVar5) {
            puVar10 = (puVar13->tree_entry).rbe_left;
            (puVar12->tree_entry).rbe_right = puVar10;
            if (puVar10 != (uv_signal_s *)0x0) {
              (((puVar13->tree_entry).rbe_left)->tree_entry).rbe_parent = puVar12;
            }
            puVar10 = (puVar12->tree_entry).rbe_parent;
            (puVar13->tree_entry).rbe_parent = puVar10;
            paVar14 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
            if (puVar10 != (uv_signal_s *)0x0) {
              puVar10 = (puVar12->tree_entry).rbe_parent;
              paVar14 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar10->tree_entry).rbe_right
              ;
              if (puVar12 == (puVar10->tree_entry).rbe_left) {
                paVar14 = &puVar10->tree_entry;
              }
            }
            paVar14->rbe_left = puVar13;
            (puVar13->tree_entry).rbe_left = puVar12;
            (puVar12->tree_entry).rbe_parent = puVar13;
            puVar10 = puVar12;
            puVar12 = puVar5;
          }
          (puVar12->tree_entry).rbe_color = 0;
          (puVar11->tree_entry).rbe_color = 1;
          puVar12 = (puVar11->tree_entry).rbe_left;
          puVar5 = (puVar12->tree_entry).rbe_right;
          (puVar11->tree_entry).rbe_left = puVar5;
          if (puVar5 != (uv_signal_s *)0x0) {
            (((puVar12->tree_entry).rbe_right)->tree_entry).rbe_parent = puVar11;
          }
          puVar5 = (puVar11->tree_entry).rbe_parent;
          (puVar12->tree_entry).rbe_parent = puVar5;
          paVar14 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
          if (puVar5 != (uv_signal_s *)0x0) {
            puVar5 = (puVar11->tree_entry).rbe_parent;
            paVar14 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar5->tree_entry).rbe_right;
            if (puVar11 == (puVar5->tree_entry).rbe_left) {
              paVar14 = &puVar5->tree_entry;
            }
          }
          paVar14->rbe_left = puVar12;
          (puVar12->tree_entry).rbe_right = puVar11;
LAB_00157e2b:
          (puVar11->tree_entry).rbe_parent = puVar12;
          puVar11 = puVar10;
        }
        else {
          if ((puVar13 == (uv_signal_s *)0x0) || ((puVar13->tree_entry).rbe_color != 1)) {
            puVar13 = (puVar12->tree_entry).rbe_left;
            if (puVar13 == puVar5) {
              puVar10 = (puVar13->tree_entry).rbe_right;
              (puVar12->tree_entry).rbe_left = puVar10;
              if (puVar10 != (uv_signal_s *)0x0) {
                (((puVar13->tree_entry).rbe_right)->tree_entry).rbe_parent = puVar12;
              }
              puVar10 = (puVar12->tree_entry).rbe_parent;
              (puVar13->tree_entry).rbe_parent = puVar10;
              paVar14 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
              if (puVar10 != (uv_signal_s *)0x0) {
                puVar10 = (puVar12->tree_entry).rbe_parent;
                paVar14 = (anon_struct_32_4_548b78d9_for_tree_entry *)
                          &(puVar10->tree_entry).rbe_right;
                if (puVar12 == (puVar10->tree_entry).rbe_left) {
                  paVar14 = &puVar10->tree_entry;
                }
              }
              paVar14->rbe_left = puVar13;
              (puVar13->tree_entry).rbe_right = puVar12;
              (puVar12->tree_entry).rbe_parent = puVar13;
              puVar10 = puVar12;
              puVar12 = puVar5;
            }
            (puVar12->tree_entry).rbe_color = 0;
            (puVar11->tree_entry).rbe_color = 1;
            puVar12 = (puVar11->tree_entry).rbe_right;
            puVar5 = (puVar12->tree_entry).rbe_left;
            (puVar11->tree_entry).rbe_right = puVar5;
            if (puVar5 != (uv_signal_s *)0x0) {
              (((puVar12->tree_entry).rbe_left)->tree_entry).rbe_parent = puVar11;
            }
            puVar5 = (puVar11->tree_entry).rbe_parent;
            (puVar12->tree_entry).rbe_parent = puVar5;
            paVar14 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
            if (puVar5 != (uv_signal_s *)0x0) {
              puVar5 = (puVar11->tree_entry).rbe_parent;
              paVar14 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar5->tree_entry).rbe_right;
              if (puVar11 == (puVar5->tree_entry).rbe_left) {
                paVar14 = &puVar5->tree_entry;
              }
            }
            paVar14->rbe_left = puVar12;
            (puVar12->tree_entry).rbe_left = puVar11;
            goto LAB_00157e2b;
          }
LAB_00157c79:
          (puVar13->tree_entry).rbe_color = 0;
          (puVar12->tree_entry).rbe_color = 0;
          (puVar11->tree_entry).rbe_color = 1;
        }
        puVar5 = puVar11;
        puVar12 = (puVar11->tree_entry).rbe_parent;
      }
      ((uv__signal_tree.rbh_root)->tree_entry).rbe_color = 0;
LAB_00157e56:
      uv__signal_unlock_and_unblock(&sStack_a8);
      handle->signal_cb = signal_cb;
      uVar3 = handle->flags;
      iVar7 = 0;
      if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
        puVar2 = &handle->loop->active_handles;
        *puVar2 = *puVar2 + 1;
      }
    }
  }
  return iVar7;
}

Assistant:

static int uv__signal_start(uv_signal_t* handle,
                            uv_signal_cb signal_cb,
                            int signum,
                            int oneshot) {
  sigset_t saved_sigmask;
  int err;
  uv_signal_t* first_handle;

  assert(!uv__is_closing(handle));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return UV_EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   * Also in case there's only one-shot handlers and a regular handler comes in.
   */
  first_handle = uv__signal_first_handle(signum);
  if (first_handle == NULL ||
      (!oneshot && (first_handle->flags & UV_SIGNAL_ONE_SHOT))) {
    err = uv__signal_register_handler(signum, oneshot);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  if (oneshot)
    handle->flags |= UV_SIGNAL_ONE_SHOT;

  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}